

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O1

point3d * tinyusdz::geometric_normal
                    (point3d *__return_storage_ptr__,point3d *p0,point3d *p1,point3d *p2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = p1->x - p0->x;
  dVar2 = p1->y - p0->y;
  dVar6 = p1->z - p0->z;
  dVar5 = p2->x - p0->x;
  dVar7 = p2->y - p0->y;
  dVar3 = p2->z - p0->z;
  dVar4 = dVar2 * dVar3 - dVar7 * dVar6;
  dVar3 = dVar6 * dVar5 - dVar3 * dVar1;
  dVar5 = dVar7 * dVar1 - dVar5 * dVar2;
  dVar2 = dVar5 * dVar5 + dVar4 * dVar4 + dVar3 * dVar3;
  dVar1 = 0.0;
  if (2.220446049250313e-16 < dVar2) {
    if (dVar2 < 0.0) {
      dVar1 = sqrt(dVar2);
    }
    else {
      dVar1 = SQRT(dVar2);
    }
  }
  if (dVar1 <= 2.220446049250313e-16) {
    dVar1 = 2.220446049250313e-16;
  }
  __return_storage_ptr__->x = dVar4 / dVar1;
  __return_storage_ptr__->y = dVar3 / dVar1;
  __return_storage_ptr__->z = dVar5 / dVar1;
  return __return_storage_ptr__;
}

Assistant:

value::point3d geometric_normal(const value::point3d &p0, const value::point3d &p1, const value::point3d &p2)
{
  value::point3d n = vcross(p1 - p0, p2 - p0);

  return vnormalize(n);
}